

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int IntersectBoxRayHelper(ON_3dPoint *rst,ON_3dVector *n,int dir,double *s)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  int local_cc;
  undefined1 local_c8 [4];
  int rc;
  ON_3dPoint local_b0;
  ON_3dVector local_98;
  ON_3dPoint local_80;
  double local_68;
  double t1;
  double t0;
  double t;
  ON_3dPoint Q;
  double nx;
  double *s_local;
  int dir_local;
  ON_3dVector *n_local;
  ON_3dPoint *rst_local;
  
  Q.z = (&n->x)[dir];
  t0 = ABS(Q.z) * 1e+100;
  dVar3 = -1.0 - (&rst->x)[dir];
  local_68 = 1.0 - (&rst->x)[dir];
  if ((t0 <= ABS(dVar3)) || (t0 <= ABS(local_68))) {
    *s = -1.23432101234321e+308;
    rst_local._4_4_ = 0;
  }
  else {
    t1 = dVar3 / Q.z;
    operator*(&local_98,t1,n);
    ON_3dPoint::operator+(&local_80,rst,&local_98);
    t = local_80.x;
    Q.x = local_80.y;
    Q.y = local_80.z;
    if (dir != 0) {
      t0 = local_80.x;
      pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&t,dir);
      dVar3 = t0;
      t = *pdVar2;
      pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&t,dir);
      *pdVar2 = dVar3;
    }
    if ((((1.490116119385e-08 < ABS(t + 1.0)) || (Q.x < -1.0000000149011612)) ||
        (1.0000000149011612 < Q.x)) || ((Q.y < -1.0000000149011612 || (1.0000000149011612 < Q.y))))
    {
      t1 = -1.23432101234321e+308;
    }
    local_68 = local_68 / Q.z;
    operator*((ON_3dVector *)local_c8,local_68,n);
    ON_3dPoint::operator+(&local_b0,rst,(ON_3dVector *)local_c8);
    t = local_b0.x;
    Q.x = local_b0.y;
    Q.y = local_b0.z;
    if (dir != 0) {
      t0 = local_b0.x;
      pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&t,dir);
      dVar3 = t0;
      t = *pdVar2;
      pdVar2 = ON_3dPoint::operator[]((ON_3dPoint *)&t,dir);
      *pdVar2 = dVar3;
    }
    if (((1.490116119385e-08 < ABS(t - 1.0)) || (Q.x < -1.0000000149011612)) ||
       ((1.0000000149011612 < Q.x || ((Q.y < -1.0000000149011612 || (1.0000000149011612 < Q.y))))))
    {
      local_68 = -1.23432101234321e+308;
      if ((t1 == -1.23432101234321e+308) && (!NAN(t1))) {
        *s = -1.23432101234321e+308;
        return 0;
      }
    }
    if (((t1 == -1.23432101234321e+308) && (!NAN(t1))) ||
       (iVar1 = BestHitHelper(t1,local_68), iVar1 == 1)) {
      local_cc = dir * 2 + 2;
      *s = local_68;
    }
    else {
      local_cc = dir * 2 + 1;
      *s = t1;
    }
    rst_local._4_4_ = local_cc;
  }
  return rst_local._4_4_;
}

Assistant:

static
int IntersectBoxRayHelper(const ON_3dPoint& rst, const ON_3dVector& n, int dir, double* s)
{
  /*
  returns:
    0 = ray parallel to sides
    1 = ray hit left side (x=-1)
    2 = ray hit right side (x=+1)
    3 = ray hit back side (y=-1)
    4 = ray hit front side (y=+1)
    5 = ray hit bottom side (z=-1)
    6 = ray hit top side (z=+1)
  */
  double nx = (&n.x)[dir];
  ON_3dPoint Q;
  double t,t0,t1;

  // protect against overflow
  t = fabs(nx)*on__overflow_tol;
  t0 = (-1.0 - (&rst.x)[dir]);
  t1 = ( 1.0 - (&rst.x)[dir]);
  if ( fabs(t0) >= t || fabs(t1) >= t )
  {
    *s = ON_UNSET_VALUE;
    return 0;
  }

  t0 /= nx;
  Q = rst + t0*n;
  if ( dir )
  {
    t = Q.x;
    Q.x = Q[dir];
    Q[dir] = t;
  }
  if ( fabs(Q.x+1.0) > ON_SQRT_EPSILON
        || Q.y < -(1.0+ON_SQRT_EPSILON) || Q.y > (1.0+ON_SQRT_EPSILON)
        || Q.z < -(1.0+ON_SQRT_EPSILON) || Q.z > (1.0+ON_SQRT_EPSILON)
        )
  {
    // The ray's intersection with the plane missed the
    // (-1,+1)x(-1,+1) square that is the side of the box.
    t0 = ON_UNSET_VALUE;
  }

  t1 /= nx;
  Q = rst + t1*n;
  if ( dir )
  {
    t = Q.x;
    Q.x = Q[dir];
    Q[dir] = t;
  }
  if ( fabs(Q.x-1.0) > ON_SQRT_EPSILON
        || Q.y < -(1.0+ON_SQRT_EPSILON) || Q.y > (1.0+ON_SQRT_EPSILON)
        || Q.z < -(1.0+ON_SQRT_EPSILON) || Q.z > (1.0+ON_SQRT_EPSILON)
        )
  {
    // The ray's intersection with the plane missed the
    // (-1,+1)x(-1,+1) square that is the side of the box.
    t1 = ON_UNSET_VALUE;
    if ( ON_UNSET_VALUE == t0 )
    {
      *s = ON_UNSET_VALUE;
      return 0;
    }
  }

  int rc;
  if ( ON_UNSET_VALUE == t0 || 1 == BestHitHelper(t0,t1) )
  {
    rc = 2 + 2*dir;
    *s = t1;
  }
  else
  {
    rc = 1 + 2*dir;
    *s = t0;
  }
  return rc;
}